

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

time_t parse_time(char *p,size_t n)

{
  uint64_t uVar1;
  time_t tVar2;
  tm local_40;
  
  local_40.tm_gmtoff = 0;
  local_40.tm_zone = (char *)0x0;
  local_40.tm_wday = 0;
  local_40.tm_yday = 0;
  local_40.tm_isdst = 0;
  local_40._36_4_ = 0;
  if (((((n == 0x14) && (uVar1 = atol10(p,4), 0x76b < (long)uVar1)) &&
       (local_40.tm_year = (int)uVar1 + -0x76c, p[4] == '-')) &&
      ((((uVar1 = atol10(p + 5,2), 0xfffffffffffffff3 < uVar1 - 0xd &&
         (local_40.tm_mon = (int)uVar1 + -1, p[7] == '-')) &&
        ((uVar1 = atol10(p + 8,2), 0xffffffffffffffe0 < uVar1 - 0x20 &&
         ((local_40.tm_mday = (int)uVar1, p[10] == 'T' && (uVar1 = atol10(p + 0xb,2), uVar1 < 0x18))
         )))) && (local_40.tm_hour = (int)uVar1, p[0xd] == ':')))) &&
     (((uVar1 = atol10(p + 0xe,2), uVar1 < 0x3c && (local_40.tm_min = (int)uVar1, p[0x10] == ':'))
      && (uVar1 = atol10(p + 0x11,2), uVar1 < 0x3d)))) {
    local_40.tm_sec = (int)uVar1;
    tVar2 = timegm(&local_40);
    return tVar2;
  }
  return 0;
}

Assistant:

static time_t
parse_time(const char *p, size_t n)
{
	struct tm tm;
	time_t t = 0;
	int64_t data;

	memset(&tm, 0, sizeof(tm));
	if (n != 20)
		return (t);
	data = atol10(p, 4);
	if (data < 1900)
		return (t);
	tm.tm_year = (int)data - 1900;
	p += 4;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 12)
		return (t);
	tm.tm_mon = (int)data -1;
	p += 2;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 31)
		return (t);
	tm.tm_mday = (int)data;
	p += 2;
	if (*p++ != 'T')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 23)
		return (t);
	tm.tm_hour = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 59)
		return (t);
	tm.tm_min = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 60)
		return (t);
	tm.tm_sec = (int)data;
#if 0
	p += 2;
	if (*p != 'Z')
		return (t);
#endif

	t = time_from_tm(&tm);

	return (t);
}